

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

void __thiscall
BloatyTest::CheckConsistencyForRow
          (BloatyTest *this,RollupRow *row,bool is_toplevel,bool diff_mode,int *count)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  byte in_CL;
  byte bVar4;
  byte in_DL;
  BloatyTest *in_RSI;
  char *in_RDI;
  int *in_R8;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  RollupRow *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *__range2;
  uint64_t filetotal;
  uint64_t vmtotal;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  value_type *in_stack_fffffffffffffe38;
  undefined6 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_fffffffffffffe48;
  int line;
  Type in_stack_fffffffffffffe5c;
  AssertHelper *in_stack_fffffffffffffe60;
  AssertionResult local_198 [2];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  AssertionResult *in_stack_fffffffffffffea8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffeb0;
  string local_148 [55];
  byte local_111;
  AssertionResult local_110;
  uint local_fc;
  string local_f8 [48];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_c8;
  undefined1 local_c0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_b8;
  undefined1 local_b0;
  AssertionResult local_a8 [2];
  reference local_88;
  RollupRow *local_80;
  __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  local_78;
  unique_ptr<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_> *local_70;
  long local_68;
  long local_60;
  int *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe8;
  
  bVar4 = in_DL & 1;
  bVar1 = in_CL & 1;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x17ba80);
  sVar3 = std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::size
                    ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                     &in_RSI[3].output_);
  if (sVar3 == 0) {
    *in_R8 = *in_R8 + 1;
  }
  else {
    local_60 = 0;
    local_68 = 0;
    local_70 = &in_RSI[3].output_;
    local_78._M_current =
         (RollupRow *)
         std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::begin
                   (in_stack_fffffffffffffe28);
    local_80 = (RollupRow *)
               std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::end
                         (in_stack_fffffffffffffe28);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                               *)in_stack_fffffffffffffe30,
                              (__normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                               *)in_stack_fffffffffffffe28), bVar2) {
      local_88 = __gnu_cxx::
                 __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
                 ::operator*(&local_78);
      local_60 = local_60 + (local_88->size).vm;
      local_68 = local_68 + (local_88->size).file;
      CheckConsistencyForRow
                (in_RSI,(RollupRow *)CONCAT17(bVar4,CONCAT16(bVar1,in_stack_ffffffffffffffe8)),
                 SUB81((ulong)in_R8 >> 0x38,0),SUB81((ulong)in_R8 >> 0x30,0),
                 in_stack_ffffffffffffffd8);
      pVar5 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe47,
                                   CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                       in_stack_fffffffffffffe38);
      in_stack_fffffffffffffe48._M_cur =
           (__node_type *)
           pVar5.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      in_stack_fffffffffffffe47 = pVar5.second;
      local_c8._M_cur = in_stack_fffffffffffffe48._M_cur;
      local_c0 = in_stack_fffffffffffffe47;
      local_b8._M_cur = in_stack_fffffffffffffe48._M_cur;
      local_b0 = in_stack_fffffffffffffe47;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)in_stack_fffffffffffffe30,(bool *)in_stack_fffffffffffffe28,
                 (type *)0x17bbfa);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_a8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                   (char *)in_stack_fffffffffffffe90._M_head_impl);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_RDI,
                   (int)((ulong)in_stack_fffffffffffffe48._M_cur >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffe47,
                                    CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffeb0._M_head_impl,
                   (Message *)in_stack_fffffffffffffea8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
        std::__cxx11::string::~string(local_f8);
        testing::Message::~Message((Message *)0x17bcd6);
      }
      local_fc = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x17bd83);
      if (local_fc != 0) goto LAB_0017c3c3;
      in_stack_fffffffffffffe46 = false;
      if ((local_88->size).vm == 0) {
        in_stack_fffffffffffffe46 = (local_88->size).file == 0;
      }
      local_111 = ~in_stack_fffffffffffffe46 & 1;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)in_stack_fffffffffffffe30,(bool *)in_stack_fffffffffffffe28,
                 (type *)0x17bde5);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_110);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                   (char *)in_stack_fffffffffffffe90._M_head_impl);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_RDI,
                   (int)((ulong)in_stack_fffffffffffffe48._M_cur >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffe47,
                                    CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffeb0._M_head_impl,
                   (Message *)in_stack_fffffffffffffea8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
        std::__cxx11::string::~string(local_148);
        testing::Message::~Message((Message *)0x17beba);
      }
      local_fc = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x17bf64);
      if (local_fc != 0) goto LAB_0017c3c3;
      __gnu_cxx::
      __normal_iterator<const_bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
      ::operator++(&local_78);
    }
    if ((bVar1 & 1) == 0) {
      testing::internal::EqHelper::Compare<unsigned_long,_long,_nullptr>
                ((char *)in_stack_fffffffffffffe48._M_cur,
                 (char *)CONCAT17(in_stack_fffffffffffffe47,
                                  CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                 (unsigned_long *)in_stack_fffffffffffffe38,(long *)in_stack_fffffffffffffe30);
      bVar2 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffea8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        in_stack_fffffffffffffe38 =
             (value_type *)testing::AssertionResult::failure_message((AssertionResult *)0x17c00b);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_RDI,
                   (int)((ulong)in_stack_fffffffffffffe48._M_cur >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffe47,
                                    CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffeb0._M_head_impl,
                   (Message *)in_stack_fffffffffffffea8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
        testing::Message::~Message((Message *)0x17c059);
      }
      local_fc = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x17c0d7);
      if (local_fc != 0) goto LAB_0017c3c3;
      testing::internal::EqHelper::Compare<unsigned_long,_long,_nullptr>
                ((char *)in_stack_fffffffffffffe48._M_cur,
                 (char *)CONCAT17(in_stack_fffffffffffffe47,
                                  CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                 (unsigned_long *)in_stack_fffffffffffffe38,(long *)in_stack_fffffffffffffe30);
      bVar2 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffe88);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        in_stack_fffffffffffffe30 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             testing::AssertionResult::failure_message((AssertionResult *)0x17c153);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_RDI,
                   (int)((ulong)in_stack_fffffffffffffe48._M_cur >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffe47,
                                    CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffeb0._M_head_impl,
                   (Message *)in_stack_fffffffffffffea8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
        testing::Message::~Message((Message *)0x17c1a1);
      }
      local_fc = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x17c219);
      if (local_fc != 0) goto LAB_0017c3c3;
    }
  }
  if (((bVar4 & 1) == 0) &&
     (sVar3 = std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::size
                        ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)
                         &in_RSI[3].output_), sVar3 == 1)) {
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::operator[]
              ((vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *)&in_RSI[3].output_,0
              );
    testing::internal::CmpHelperNE<char[7],std::__cxx11::string>
              ((char *)in_stack_fffffffffffffe48._M_cur,
               (char *)CONCAT17(in_stack_fffffffffffffe47,
                                CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
               (char (*) [7])in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    line = (int)((ulong)in_stack_fffffffffffffe48._M_cur >> 0x20);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_198);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe60);
      testing::AssertionResult::failure_message((AssertionResult *)0x17c2d9);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_RDI,line,
                 (char *)CONCAT17(in_stack_fffffffffffffe47,
                                  CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffeb0._M_head_impl,
                 (Message *)in_stack_fffffffffffffea8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0x17c325);
    }
    local_fc = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x17c39d);
    if (local_fc != 0) goto LAB_0017c3c3;
  }
  local_fc = 0;
LAB_0017c3c3:
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x17c3d0);
  return;
}

Assistant:

void CheckConsistencyForRow(const bloaty::RollupRow& row, bool is_toplevel,
                             bool diff_mode, int* count) {
    // If any children exist, they should sum up to this row's values.
    // Also none of the children should have the same name.
    std::unordered_set<std::string> names;

    if (row.sorted_children.size() > 0) {
      uint64_t vmtotal = 0;
      uint64_t filetotal = 0;
      for (const auto& child : row.sorted_children) {
        vmtotal += child.size.vm;
        filetotal += child.size.file;
        CheckConsistencyForRow(child, false, diff_mode, count);
        ASSERT_TRUE(names.insert(child.name).second);
        ASSERT_FALSE(child.size.vm == 0 && child.size.file == 0);
      }

      if (!diff_mode) {
        ASSERT_EQ(vmtotal, row.size.vm);
        ASSERT_EQ(filetotal, row.size.file);
      }
    } else {
      // Count leaf rows.
      *count += 1;
    }

    if (!is_toplevel && row.sorted_children.size() == 1) {
      ASSERT_NE(NONE_STRING, row.sorted_children[0].name);
    }
  }